

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O0

void __thiscall QLineEdit::setSelection(QLineEdit *this,int start,int length)

{
  int iVar1;
  QLineEditPrivate *this_00;
  QStyle *pQVar2;
  undefined4 in_EDX;
  uint in_ESI;
  QLineEditPrivate *in_RDI;
  long in_FS_OFFSET;
  QLineEditPrivate *d;
  QStyleOptionFrame opt;
  undefined4 in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  undefined7 in_stack_ffffffffffffff68;
  bool bVar3;
  uint uVar4;
  undefined1 visible;
  QLineEditPrivate *this_01;
  char local_78 [32];
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = d_func((QLineEdit *)0x5c4f38);
  bVar3 = true;
  uVar4 = in_ESI;
  if (-1 < (int)in_ESI) {
    iVar1 = QWidgetLineControl::end((QWidgetLineControl *)0x5c4f63);
    bVar3 = iVar1 < (int)in_ESI;
    in_stack_ffffffffffffff5c = in_ESI;
  }
  if (bVar3 == false) {
    QWidgetLineControl::setSelection
              ((QWidgetLineControl *)CONCAT44(uVar4,in_EDX),(int)((ulong)this_00 >> 0x20),
               (int)this_00);
    visible = (undefined1)(uVar4 >> 0x18);
    bVar3 = QWidgetLineControl::hasSelectedText((QWidgetLineControl *)in_RDI);
    if (bVar3) {
      memset(local_58,0xaa,0x50);
      QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)0x5c4ffd);
      (**(code **)(*(long *)&in_RDI->super_QWidgetPrivate + 0x1a0))(in_RDI,local_58);
      pQVar2 = QWidget::style((QWidget *)
                              CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      iVar1 = (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,0x1c,local_58,in_RDI,0);
      if (iVar1 == 0) {
        QLineEditPrivate::setCursorVisible(this_01,(bool)visible);
      }
      QStyleOptionFrame::~QStyleOptionFrame((QStyleOptionFrame *)0x5c5053);
    }
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,(char *)CONCAT17(bVar3,in_stack_ffffffffffffff68),
               (int)((ulong)in_RDI >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    QMessageLogger::warning
              (local_78,"QLineEdit::setSelection: Invalid start position (%d)",(ulong)uVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLineEdit::setSelection(int start, int length)
{
    Q_D(QLineEdit);
    if (Q_UNLIKELY(start < 0 || start > (int)d->control->end())) {
        qWarning("QLineEdit::setSelection: Invalid start position (%d)", start);
        return;
    }

    d->control->setSelection(start, length);

    if (d->control->hasSelectedText()){
        QStyleOptionFrame opt;
        initStyleOption(&opt);
        if (!style()->styleHint(QStyle::SH_BlinkCursorWhenTextSelected, &opt, this))
            d->setCursorVisible(false);
    }
}